

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::
str<char_const(&)[10],char_const*const&,char_const(&)[3],int_const&,char_const(&)[3],kj::String_const&>
          (String *__return_storage_ptr__,kj *this,char (*params) [10],char **params_1,
          char (*params_2) [3],int *params_3,char (*params_4) [3],String *params_5)

{
  char *pcVar1;
  ArrayPtr<const_char> *in_stack_ffffffffffffff60;
  ArrayPtr<const_char> local_98;
  ArrayPtr<const_char> local_88;
  ArrayPtr<const_char> local_78;
  ArrayPtr<const_char> local_68;
  ArrayPtr<const_char> local_58;
  CappedArray<char,_14UL> local_48;
  
  local_68 = toCharSequence<char_const(&)[10]>((char (*) [10])this);
  local_78 = toCharSequence<char_const*const&>((char **)params);
  local_88 = toCharSequence<char_const(&)[3]>((char (*) [3])params_1);
  toCharSequence<int_const&>(&local_48,(kj *)params_2,(int *)local_88.size_);
  local_98 = toCharSequence<char_const(&)[3]>((char (*) [3])params_3);
  pcVar1 = *(char **)(params_4[2] + 2);
  local_58.ptr = pcVar1;
  if (pcVar1 != (char *)0x0) {
    local_58.ptr = *(char **)params_4;
  }
  local_58.size_ = (size_t)(char *)0x0;
  if (pcVar1 != (char *)0x0) {
    local_58.size_ = (size_t)(pcVar1 + -1);
  }
  _::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_68,&local_78,&local_88,
             (ArrayPtr<const_char> *)&local_48,(CappedArray<char,_14UL> *)&local_98,&local_58,
             in_stack_ffffffffffffff60);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}